

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  JavaType JVar3;
  int iVar4;
  uint uVar5;
  Descriptor *pDVar6;
  FieldDescriptor *field_00;
  allocator local_49;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *value;
  FieldDescriptor *pFStack_18;
  int extra_bits;
  FieldDescriptor *field_local;
  
  pFStack_18 = field;
  bVar1 = FieldDescriptor::is_required(field);
  value._4_4_ = 0;
  if (bVar1) {
    value._4_4_ = 0x100;
  }
  TVar2 = FieldDescriptor::type(pFStack_18);
  if ((TVar2 == TYPE_STRING) && (bVar1 = CheckUtf8(pFStack_18), bVar1)) {
    value._4_4_ = value._4_4_ | 0x200;
  }
  bVar1 = FieldDescriptor::is_required(pFStack_18);
  if (!bVar1) {
    JVar3 = GetJavaType(pFStack_18);
    if (JVar3 != JAVATYPE_MESSAGE) goto LAB_0047f46c;
    pDVar6 = FieldDescriptor::message_type(pFStack_18);
    bVar1 = HasRequiredFields(pDVar6);
    if (!bVar1) goto LAB_0047f46c;
  }
  value._4_4_ = value._4_4_ | 0x400;
LAB_0047f46c:
  bVar1 = HasHasbit(pFStack_18);
  if (bVar1) {
    value._4_4_ = value._4_4_ | 0x1000;
  }
  bVar1 = FieldDescriptor::is_map(pFStack_18);
  if (bVar1) {
    bVar1 = SupportUnknownEnumValue(pFStack_18);
    if (!bVar1) {
      pDVar6 = FieldDescriptor::message_type(pFStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,"value",&local_49);
      field_00 = Descriptor::FindFieldByName(pDVar6,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      local_28 = field_00;
      JVar3 = GetJavaType(field_00);
      if (JVar3 == JAVATYPE_ENUM) {
        value._4_4_ = value._4_4_ | 0x800;
      }
    }
    field_local._4_4_ = value._4_4_ | 0x32;
  }
  else {
    bVar1 = FieldDescriptor::is_packed(pFStack_18);
    if (bVar1) {
      field_local._4_4_ = GetExperimentalJavaFieldTypeForPacked(pFStack_18);
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(pFStack_18);
      if (bVar1) {
        uVar5 = GetExperimentalJavaFieldTypeForRepeated(pFStack_18);
        field_local._4_4_ = uVar5 | value._4_4_;
      }
      else {
        bVar1 = IsRealOneof(pFStack_18);
        if (bVar1) {
          iVar4 = GetExperimentalJavaFieldTypeForSingular(pFStack_18);
          field_local._4_4_ = iVar4 + 0x33U | value._4_4_;
        }
        else {
          uVar5 = GetExperimentalJavaFieldTypeForSingular(pFStack_18);
          field_local._4_4_ = uVar5 | value._4_4_;
        }
      }
    }
  }
  return field_local._4_4_;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;
  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kMapWithProto2EnumValue = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(field)) {
      const FieldDescriptor* value =
          field->message_type()->FindFieldByName("value");
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kMapWithProto2EnumValue;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field);
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}